

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::
Action<const_solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>::
Perform(Action<const_solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
        *this,ArgumentTuple *args)

{
  bool bVar1;
  TableauPileCollider *pTVar2;
  ArgumentTuple *args_local;
  Action<const_solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  pTVar2 = internal::
           Apply<std::function<solitaire::colliders::interfaces::TableauPileCollider_const&(solitaire::piles::PileId)>const&,std::tuple<solitaire::piles::PileId>>
                     (&this->fun_,args);
  return pTVar2;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }